

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

ImageHeaders core::image::load_file_headers(string *filename)

{
  ImageHeaders IVar1;
  
  IVar1 = load_png_file_headers(filename);
  return IVar1;
}

Assistant:

ImageHeaders
load_file_headers (std::string const& filename)
{
    try
    {
#ifndef MVE_NO_PNG_SUPPORT
        try
        { return load_png_file_headers(filename); }
        catch (util::FileException&) { throw; }
        catch (util::Exception&) {}
#endif

#ifndef MVE_NO_JPEG_SUPPORT
        try
        { return load_jpg_file_headers(filename); }
        catch (util::FileException&) { throw; }
        catch (util::Exception&) {}
#endif

        try
        { return load_mvei_file_headers(filename); }
        catch (util::FileException&) { throw; }
        catch (util::Exception&) {}
    }
    catch (util::FileException& e)
    {
        throw util::Exception(filename + ": ", e.what());
    }

    throw util::Exception(filename, ": Cannot determine image format");
}